

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchSolve.cpp
# Opt level: O2

bool Bmatch_GetGuess(vector<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                     *f,vector<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                        *g,vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                           *fo,
                    vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                    *gi,PI_PO_INFO *pInformation,METHOD method)

{
  vector<suppWrap_*,_std::allocator<suppWrap_*>_> *pvVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  pointer pvVar5;
  const_iterator __position;
  pointer ppVar6;
  suppWrap **ppsVar7;
  pointer ppsVar8;
  pointer *this;
  ostream *poVar9;
  suppWrap *psVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  vector<suppWrap_*,_std::allocator<suppWrap_*>_> *pvVar15;
  undefined8 unaff_RBX;
  suppWrap *psVar16;
  ulong uVar17;
  suppWrap **b;
  bool bVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  suppWrap *tmpWrap1;
  vector<suppWrap_*,_std::allocator<suppWrap_*>_> mapNodes;
  suppWrap *tmpW;
  pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_> tmpPair;
  pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_> local_50;
  
  if (((f->
       super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start ==
       (f->
       super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish) ||
     ((g->
      super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (g->
      super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    __assert_fail("!f.empty() && !g.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bmatch/bmatchSolve.cpp"
                  ,0x77,
                  "bool Bmatch_GetGuess(vector<vector<suppWrap *>> &, vector<vector<suppWrap *>> &, vector<pair<suppWrap *, vector<suppWrap *>>> &, vector<pair<suppWrap *, vector<suppWrap *>>> &, PI_PO_INFO *, METHOD)"
                 );
  }
  tmpPair.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tmpPair.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mapNodes.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tmpPair.first = (suppWrap *)0x0;
  tmpPair.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mapNodes.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mapNodes.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar16 = (suppWrap *)CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
  if (method != M_ONE_TO_ONE) {
LAB_0063d72f:
    std::_Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>::~_Vector_base
              (&mapNodes.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>);
    std::_Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>::~_Vector_base
              (&tmpPair.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>);
    return SUB81(psVar16,0);
  }
  bVar18 = false;
  uVar17 = 0;
LAB_0063d35d:
  uVar11 = uVar17;
  if (bVar18) {
    std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::push_back(&mapNodes,&tmpWrap1);
    local_50.first = psVar16;
    std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::vector(&local_50.second,&mapNodes);
    std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>::operator=
              (&tmpPair,&local_50);
    std::_Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>::~_Vector_base
              (&local_50.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>);
    std::
    vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
    ::push_back(fo,&tmpPair);
    if (mapNodes.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        mapNodes.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      mapNodes.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           mapNodes.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    uVar17 = (ulong)((long)(tmpWrap1->funSupp).
                           super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(tmpWrap1->funSupp).
                          super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3;
    uVar11 = uVar17 & 0xffffffff;
    if ((int)uVar17 < 1) {
      uVar11 = 0;
    }
    for (uVar17 = 0; uVar17 != uVar11; uVar17 = uVar17 + 1) {
      tmpW = Bmatch_FindSuppWrap(&pInformation->_x_match,
                                 (tmpWrap1->funSupp).
                                 super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl
                                 .super__Vector_impl_data._M_start + uVar17);
      if (tmpW == (suppWrap *)0x0) {
        uVar13 = (ulong)((long)(psVar16->funSupp).
                               super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(psVar16->funSupp).
                              super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3;
        uVar14 = uVar13 & 0xffffffff;
        if ((int)uVar13 < 1) {
          uVar14 = 0;
        }
        for (lVar12 = 0; uVar14 * 8 != lVar12; lVar12 = lVar12 + 8) {
          ppsVar8 = (psVar16->funSupp).super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          iVar3 = **(int **)((long)ppsVar8 + lVar12);
          iVar4 = (tmpWrap1->funSupp).super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar17]->numOfInfluence;
          if ((iVar4 + -1 <= iVar3) && (iVar3 <= iVar4 + 1)) {
            std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::push_back
                      (&mapNodes,(value_type *)((long)ppsVar8 + lVar12));
          }
        }
      }
      else {
        std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::push_back(&mapNodes,&tmpW);
      }
      std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>::
      pair<suppWrap_*&,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_&,_true>
                (&local_50,
                 (tmpWrap1->funSupp).super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar17,&mapNodes);
      std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>::operator=
                (&tmpPair,&local_50);
      std::_Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>::~_Vector_base
                (&local_50.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>);
      std::
      vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
      ::push_back(gi,&tmpPair);
      if (mapNodes.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          mapNodes.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        mapNodes.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             mapNodes.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
    }
    psVar16 = (suppWrap *)0x1;
  }
  else {
    if (((long)(f->
               super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
        (long)(f->
              super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start) / 0x18 != uVar11) {
      uVar17 = uVar11 + 1;
LAB_0063d39f:
      pvVar5 = (f->
               super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      __position._M_current =
           pvVar5[uVar11].super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      if (__position._M_current !=
          *(pointer *)
           ((long)&pvVar5[uVar11].super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                   _M_impl.super__Vector_impl_data + 8)) {
        ppVar6 = (pInformation->_f_match).
                 super__Vector_base<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar13 = (ulong)((long)(pInformation->_f_match).
                               super__Vector_base<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar6) >> 5;
        uVar14 = uVar13 & 0xffffffff;
        if ((int)uVar13 < 1) {
          uVar14 = 0;
        }
        psVar16 = *__position._M_current;
        lVar12 = 0;
LAB_0063d3e1:
        if (uVar14 * 0x20 + 0x20 != lVar12 + 0x20) goto code_r0x0063d3ea;
        pvVar5 = (g->
                 super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar13 = ((long)(g->
                        super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5) / 0x18;
        if ((int)uVar13 < (int)uVar17) {
          uVar13 = uVar17;
        }
        for (uVar14 = (ulong)((int)uVar11 + -1 + (uint)(uVar11 == 0));
            uVar14 < (uVar13 & 0xffffffff); uVar14 = uVar14 + 1) {
          ppsVar7 = pvVar5[uVar14].super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar19 = (ulong)((long)*(pointer *)
                                  ((long)&pvVar5[uVar14].
                                          super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>
                                          ._M_impl.super__Vector_impl_data + 8) - (long)ppsVar7) >>
                   3;
          uVar20 = uVar19 & 0xffffffff;
          if ((int)uVar19 < 1) {
            uVar20 = 0;
          }
          while (b = ppsVar7, bVar21 = uVar20 != 0, uVar20 = uVar20 - 1, bVar21) {
            psVar10 = Bmatch_FindSuppWrap(&pInformation->_f_already_try,b);
            ppsVar7 = b + 1;
            if (psVar10 != psVar16) {
              tmpWrap1 = *b;
              ppVar6 = (pInformation->_f_already_try).
                       super__Vector_base<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar11 = (ulong)((long)(pInformation->_f_already_try).
                                     super__Vector_base<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar6) >> 5
              ;
              uVar13 = uVar11 & 0xffffffff;
              if ((int)uVar11 < 1) {
                uVar13 = 0;
              }
              lVar12 = uVar13 + 1;
              pvVar15 = &ppVar6[-1].second;
              goto LAB_0063d4e8;
            }
          }
        }
        goto LAB_0063d413;
      }
      goto LAB_0063d35d;
    }
    psVar16 = (suppWrap *)0x0;
  }
  goto LAB_0063d72f;
code_r0x0063d3ea:
  puVar2 = (undefined8 *)((long)&ppVar6->first + lVar12);
  lVar12 = lVar12 + 0x20;
  if (psVar16 == (suppWrap *)*puVar2) goto LAB_0063d3f3;
  goto LAB_0063d3e1;
LAB_0063d3f3:
  std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::erase(pvVar5 + uVar11,__position);
  poVar9 = std::operator<<((ostream *)&std::cout,"Not GOOD ");
  std::endl<char,std::char_traits<char>>(poVar9);
LAB_0063d413:
  pvVar5 = (f->
           super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::erase
            (pvVar5 + uVar11,
             (const_iterator)
             pvVar5[uVar11].super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
             super__Vector_impl_data._M_start);
  goto LAB_0063d39f;
  while (this = (pointer *)
                ((long)&pvVar15[1].super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                        _M_impl + 8), pvVar1 = pvVar15 + 1,
        pvVar15 = (vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)this,
        *(suppWrap **)&(pvVar1->super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>)._M_impl
        != psVar16) {
LAB_0063d4e8:
    lVar12 = lVar12 + -1;
    if (lVar12 == 0) {
      std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::push_back(&mapNodes,&tmpWrap1);
      local_50.first = psVar16;
      std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::vector(&local_50.second,&mapNodes);
      std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>::operator=
                (&tmpPair,&local_50);
      std::_Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>::~_Vector_base
                (&local_50.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>);
      std::
      vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
      ::push_back(&pInformation->_f_already_try,&tmpPair);
      bVar18 = true;
      if (mapNodes.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          mapNodes.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        mapNodes.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             mapNodes.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      goto LAB_0063d35d;
    }
  }
  std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::push_back
            ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)this,&tmpWrap1);
  bVar18 = true;
  goto LAB_0063d35d;
}

Assistant:

bool Bmatch_GetGuess ( vector< vector< suppWrap * > > & f,
					   vector< vector< suppWrap * > > & g,
					   vector< pair< suppWrap *, vector< suppWrap * > > > & fo,
					   vector< pair< suppWrap *, vector< suppWrap * > > > & gi,
					   PI_PO_INFO * pInformation,
					   METHOD method )
{
	assert( !f.empty() && !g.empty() );
	pair< suppWrap *, vector< suppWrap * > > tmpPair;
	vector< suppWrap * > mapNodes;
	suppWrap * tmpWrap1, * tmpWrap2, * tmpW;
	int piCap = 3, poCap = 1, currentIndex = 0;
	bool done = false, findPair = false, save = false, notGood = false;

    //int capacity = ( Abc_NtkPoNum( tmpInformation->_cir1 ) - Abc_NtkPoNum( tmpInformation->_cir2 ) );
    //capacity = (capacity >= 0) ? capacity + 1 : 1;

	switch( method ) {
		case M_ONE_TO_ONE:
            while( !findPair ) {
                if( currentIndex == f.size() ) return false;
                else { 
                    while( !f[currentIndex].empty() ){
                        tmpWrap2 = f[currentIndex][0];
                        for( int i = 0, n = pInformation->_f_match.size(); i < n; ++i ) {
                            if( tmpWrap2 == pInformation->_f_match[i].first ) {
                                f[currentIndex].erase(f[currentIndex].begin());
                    cout << "Not GOOD " << endl;
                                notGood = true;
                                break;
                            }
                        }
                        if( !notGood ) {
                        for( int i = (currentIndex >= poCap) ? currentIndex - poCap : 0,
                                 n = max((int)g.size(), currentIndex + poCap); i < n; ++i ) {
                            for( int j = 0, m = g[i].size(); j < m; ++j ) {
                                if( !(Bmatch_FindSuppWrap( pInformation->_f_already_try, g[i][j] ) == tmpWrap2) ) {
                                    tmpWrap1 = g[i][j];

                                    for( int k = 0, l = pInformation->_f_already_try.size(); k < l; ++k ) {
                                        if( pInformation->_f_already_try[k].first == tmpWrap2 ) {
                                            pInformation->_f_already_try[k].second.push_back(tmpWrap1);
                                            save = true;
                                            break;
                                        }
                                    }
                                    if( !save ) {
                                        mapNodes.push_back(tmpWrap1);
                                        tmpPair = make_pair(tmpWrap2, mapNodes);
                                        pInformation->_f_already_try.push_back(tmpPair);
                                        mapNodes.clear();
                                    }
                                    save = false;
                                    findPair = true;
                                    break;
                                }
                            }
                            if( findPair ) break;
                        }
                        }
                        notGood = false;
                        if( !findPair ) {
                            f[currentIndex].erase(f[currentIndex].begin());
                        }
                        else break;
                    }
                }
                ++currentIndex;
            }
            //
			// tmpWrap1 = g[0][0]; tmpWrap2 = f[0][0];
			mapNodes.push_back( tmpWrap1 );
			tmpPair = make_pair( tmpWrap2, mapNodes );
			fo.push_back(tmpPair);

			mapNodes.clear();
			for( int i = 0, n = tmpWrap1->funSupp.size(); i < n; ++i ) {
				tmpW = Bmatch_FindSuppWrap( pInformation->_x_match, tmpWrap1->funSupp[i] );
				if( tmpW != NULL ) {
					mapNodes.push_back( tmpW );
					done = true;
				}
				if( !done ) {
					for( int j = 0, m = tmpWrap2->funSupp.size(); j < m; ++j ) {
						if( tmpWrap2->funSupp[j]->numOfInfluence >= tmpWrap1->funSupp[i]->numOfInfluence - poCap &&
							tmpWrap2->funSupp[j]->numOfInfluence <= tmpWrap1->funSupp[i]->numOfInfluence + poCap ) {
							mapNodes.push_back( tmpWrap2->funSupp[j] );
						}
					}
				}
				tmpPair = make_pair( tmpWrap1->funSupp[i], mapNodes );
				gi.push_back(tmpPair);
				mapNodes.clear();
				done = false;
			}
            //
		break;
		default:
		break;
	}
    return true;
}